

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

InstanceConfigRuleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceConfigRuleSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax>const&,slang::syntax::ConfigRuleClauseSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,
          SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *args_2,
          ConfigRuleClauseSyntax *args_3,Token *args_4)

{
  size_type sVar1;
  pointer ppCVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  SyntaxKind SVar14;
  undefined4 uVar15;
  TokenKind TVar16;
  undefined1 uVar17;
  NumericTokenFlags NVar18;
  uint32_t uVar19;
  InstanceConfigRuleSyntax *pIVar20;
  long lVar21;
  
  pIVar20 = (InstanceConfigRuleSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InstanceConfigRuleSyntax *)this->endPtr < pIVar20 + 1) {
    pIVar20 = (InstanceConfigRuleSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pIVar20 + 1);
  }
  TVar6 = args->kind;
  uVar7 = args->field_0x2;
  NVar8.raw = (args->numFlags).raw;
  uVar9 = args->rawLen;
  pIVar3 = args->info;
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar4 = args_1->info;
  TVar16 = args_4->kind;
  uVar17 = args_4->field_0x2;
  NVar18.raw = (args_4->numFlags).raw;
  uVar19 = args_4->rawLen;
  pIVar5 = args_4->info;
  (pIVar20->super_ConfigRuleSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pIVar20->super_ConfigRuleSyntax).super_SyntaxNode.kind = InstanceConfigRule;
  (pIVar20->instance).kind = TVar6;
  (pIVar20->instance).field_0x2 = uVar7;
  (pIVar20->instance).numFlags = (NumericTokenFlags)NVar8.raw;
  (pIVar20->instance).rawLen = uVar9;
  (pIVar20->instance).info = pIVar3;
  (pIVar20->topModule).kind = TVar10;
  (pIVar20->topModule).field_0x2 = uVar11;
  (pIVar20->topModule).numFlags = (NumericTokenFlags)NVar12.raw;
  (pIVar20->topModule).rawLen = uVar13;
  (pIVar20->topModule).info = pIVar4;
  SVar14 = (args_2->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar15 = *(undefined4 *)&(args_2->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pIVar20->instanceNames).super_SyntaxListBase.super_SyntaxNode.parent =
       (args_2->super_SyntaxListBase).super_SyntaxNode.parent;
  (pIVar20->instanceNames).super_SyntaxListBase.super_SyntaxNode.kind = SVar14;
  *(undefined4 *)&(pIVar20->instanceNames).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar15;
  (pIVar20->instanceNames).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (pIVar20->instanceNames).super_SyntaxListBase.childCount =
       (args_2->super_SyntaxListBase).childCount;
  sVar1 = (args_2->
          super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>).size_
  ;
  (pIVar20->instanceNames).
  super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>.data_ =
       (args_2->super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>)
       .data_;
  (pIVar20->instanceNames).
  super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (pIVar20->instanceNames).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0050b660;
  (pIVar20->ruleClause).ptr = args_3;
  (pIVar20->semi).kind = TVar16;
  (pIVar20->semi).field_0x2 = uVar17;
  (pIVar20->semi).numFlags = (NumericTokenFlags)NVar18.raw;
  (pIVar20->semi).rawLen = uVar19;
  (pIVar20->semi).info = pIVar5;
  (pIVar20->instanceNames).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pIVar20;
  sVar1 = (pIVar20->instanceNames).
          super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppCVar2 = (pIVar20->instanceNames).
              super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>.
              data_;
    lVar21 = 0;
    do {
      **(undefined8 **)((long)ppCVar2 + lVar21) = pIVar20;
      lVar21 = lVar21 + 8;
    } while (sVar1 << 3 != lVar21);
  }
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)pIVar20;
  return pIVar20;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }